

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void palette_rebuild(Terminal *term)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  term_subpalette *ptVar9;
  
  if (term->win_palette_pending == true) {
    uVar5 = term->win_palette_pending_min;
    uVar4 = term->win_palette_pending_limit - 1;
  }
  else {
    uVar4 = 0;
    uVar5 = 0x106;
  }
  lVar6 = 0x1eaa;
  lVar8 = 0;
  while( true ) {
    if (lVar8 == 0x106) {
      if (uVar4 < uVar5) {
        return;
      }
      term->win_palette_pending = true;
      term->win_palette_pending_min = uVar5;
      term->win_palette_pending_limit = uVar4 + 1;
      term_invalidate(term);
      return;
    }
    ptVar9 = term->subpalettes + 2;
    if (((term->subpalettes[2].present[lVar8] == false) &&
        (ptVar9 = term->subpalettes + 1, term->subpalettes[1].present[lVar8] == false)) &&
       (ptVar9 = term->subpalettes, term->subpalettes[0].present[lVar8] == false)) break;
    cVar1 = *(char *)((long)ptVar9 + lVar6 + -0x1eaa);
    cVar2 = *(char *)((long)ptVar9 + lVar6 + -0x1ea9);
    cVar3 = *(char *)((long)ptVar9 + lVar6 + -0x1ea8);
    if (((cVar1 != *(char *)((long)term + lVar6 + -2)) ||
        (cVar2 != *(char *)((long)term + lVar6 + -1))) ||
       (cVar3 != *(char *)((long)&term->compatibility_level + lVar6))) {
      *(char *)((long)term + lVar6 + -2) = cVar1;
      *(char *)((long)term + lVar6 + -1) = cVar2;
      *(char *)((long)&term->compatibility_level + lVar6) = cVar3;
      uVar7 = (uint)lVar8;
      if (uVar7 <= uVar5) {
        uVar5 = uVar7;
      }
      if (uVar4 <= uVar7) {
        uVar4 = uVar7;
      }
    }
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 3;
  }
  __assert_fail("found",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x736,"void palette_rebuild(Terminal *)");
}

Assistant:

static void palette_rebuild(Terminal *term)
{
    unsigned min_changed = OSC4_NCOLOURS, max_changed = 0;

    if (term->win_palette_pending) {
        /* Possibly extend existing range. */
        min_changed = term->win_palette_pending_min;
        max_changed = term->win_palette_pending_limit - 1;
    } else {
        /* Start with empty range. */
        min_changed = OSC4_NCOLOURS;
        max_changed = 0;
    }

    for (unsigned i = 0; i < OSC4_NCOLOURS; i++) {
        rgb new_value;
        bool found = false;

        for (unsigned j = lenof(term->subpalettes); j-- > 0 ;) {
            if (term->subpalettes[j].present[i]) {
                new_value = term->subpalettes[j].values[i];
                found = true;
                break;
            }
        }

        assert(found);    /* we expect SUBPAL_CONF to always be set */

        if (new_value.r != term->palette[i].r ||
            new_value.g != term->palette[i].g ||
            new_value.b != term->palette[i].b) {
            term->palette[i] = new_value;
            if (min_changed > i)
                min_changed = i;
            if (max_changed < i)
                max_changed = i;
        }
    }

    if (min_changed <= max_changed) {
        /*
         * At least one colour changed (or we had an update scheduled
         * already). Schedule a redraw event to pass the result back
         * to the TermWin. This also requires invalidating the rest
         * of the window, because usually all the text will need
         * redrawing in the new colours.
         * (If there was an update pending and this palette rebuild
         * didn't actually change anything, we'll harmlessly reinforce
         * the existing update request.)
         */
        term->win_palette_pending = true;
        term->win_palette_pending_min = min_changed;
        term->win_palette_pending_limit = max_changed + 1;
        term_invalidate(term);
    }
}